

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::DiscardOStream::DiscardOStream(DiscardOStream *this)

{
  std::ios::ios((ios *)&this->field_0x448);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x121c50;
  *(undefined8 *)&this->field_0x448 = 0x121c78;
  std::ostream::ostream(this,(streambuf *)&PTR_construction_vtable_24__00121c90);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x121c50;
  *(undefined8 *)&this->field_0x448 = 0x121c78;
  {unnamed_type#1}::DiscardOStream((_unnamed_type_1_ *)&(this->super_ostream).field_0x8);
  return;
}

Assistant:

DiscardOStream()
            : std::ostream(&discardBuf) {}